

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_assign(irGenerator *this,LeftVal *dest,uint32_t sourceId)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  VarId *__p;
  AssignInst *__p_00;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_00;
  undefined1 local_a8 [16];
  byte local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  anon_class_8_1_a78179b7_conflict local_80;
  undefined **local_78;
  variant<int,_mir::inst::VarId> local_70;
  LeftVal local_58;
  
  __p = (VarId *)operator_new(0x10);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58,
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  uVar3 = LeftValueToLabelId(this,&local_58);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  __p->id = uVar3;
  local_a8._0_8_ = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::VarId*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),__p);
  uVar2 = local_a8._8_8_;
  uVar1 = local_a8._0_8_;
  local_a8._0_8_ = 0;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_58.
     super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_80,&local_58);
  local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  local_58.
  super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
  local_a8._0_8_ = operator_new(0x20);
  *(undefined ***)&((Value *)local_a8._0_8_)->field_0x8 = &PTR_display_001eb100;
  *(uint32_t *)&((Value *)local_a8._0_8_)->field_0x10 = sourceId;
  ((Value *)local_a8._0_8_)->field_0x18 = 1;
  (((Value *)local_a8._0_8_)->super_Displayable)._vptr_Displayable =
       (_func_int **)&PTR_display_001ecf98;
  ((Value *)local_a8._0_8_)->shift = Lsl;
  ((Value *)local_a8._0_8_)->shift_amount = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::Value*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),(Value *)local_a8._0_8_);
  uVar2 = local_a8._0_8_;
  local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
  __p_00 = (AssignInst *)operator_new(0x38);
  uVar3 = *(uint32_t *)(uVar1 + 8);
  local_70.super__Variant_base<int,_mir::inst::VarId>.
  super__Move_assign_alias<int,_mir::inst::VarId>.super__Copy_assign_alias<int,_mir::inst::VarId>.
  super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = *(__index_type *)(uVar2 + 0x18);
  local_80.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_70;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_70.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
            (&local_80,(variant<int,_mir::inst::VarId> *)(uVar2 + 8));
  local_78 = &PTR_display_001ecf98;
  local_70.super__Variant_base<int,_mir::inst::VarId>.
  super__Move_assign_alias<int,_mir::inst::VarId>.super__Copy_assign_alias<int,_mir::inst::VarId>.
  super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
  super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = *(undefined2 *)(uVar2 + 0x19);
  (__p_00->super_Inst).dest.super_Displayable._vptr_Displayable =
       (_func_int **)&PTR_display_001eb100;
  (__p_00->super_Inst).dest.id = uVar3;
  (__p_00->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecfe8;
  local_80.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&(__p_00->src).field_0x8;
  (__p_00->src).field_0x18 =
       local_70.super__Variant_base<int,_mir::inst::VarId>.
       super__Move_assign_alias<int,_mir::inst::VarId>.
       super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>
       .super__Copy_ctor_alias<int,_mir::inst::VarId>.
       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_70.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
            (&local_80,&local_70);
  (__p_00->src).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf98;
  (__p_00->src).shift =
       local_70.super__Variant_base<int,_mir::inst::VarId>.
       super__Move_assign_alias<int,_mir::inst::VarId>.
       super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>
       .super__Copy_ctor_alias<int,_mir::inst::VarId>.
       super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_;
  (__p_00->src).shift_amount =
       local_70.super__Variant_base<int,_mir::inst::VarId>.
       super__Move_assign_alias<int,_mir::inst::VarId>.
       super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>
       .super__Copy_ctor_alias<int,_mir::inst::VarId>.
       super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_;
  local_a8._0_8_ = __p_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::AssignInst*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),__p_00);
  uVar2 = local_a8._8_8_;
  uVar1 = local_a8._0_8_;
  this_00 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(uVar2 + 8) = *(_Atomic_word *)(uVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(uVar2 + 8) = *(_Atomic_word *)(uVar2 + 8) + 1;
    }
  }
  local_98 = 0;
  local_a8._0_8_ = uVar1;
  local_a8._8_8_ = uVar2;
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_00,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_a8);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
    ::_S_vtable._M_arr[local_98]._M_data)
            ((anon_class_1_0_00000001 *)&local_80,
             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)local_a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  return;
}

Assistant:

void irGenerator::ir_assign(LeftVal dest, uint32_t sourceId) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> srcValue;
  shared_ptr<mir::inst::AssignInst> assginInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  srcValue = shared_ptr<Value>(new Value(VarId(sourceId)));

  assginInst = shared_ptr<mir::inst::AssignInst>(
      new mir::inst::AssignInst(*destVarId, *srcValue));

  _funcNameToInstructions[_funcStack.back()].push_back(assginInst);
}